

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O3

int generate_shapes(map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                    *faces_map,
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *materials_map,string *geo_file_path)

{
  _Rb_tree_node_base *__args;
  int iVar1;
  iterator __position;
  bool bVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  uint uVar9;
  iterator placeholder;
  _Self __tmp;
  int iVar10;
  _Base_ptr p_Var11;
  _Self __tmp_2;
  pointer piVar12;
  ulong uVar13;
  int *piVar14;
  bool bVar15;
  vector<int,_std::allocator<int>_> current_shape_vector;
  map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_> current_faces_map;
  string curve_loop;
  ostringstream curve;
  ofstream geo_file;
  int local_448;
  uint local_444;
  int local_440;
  int local_43c;
  vector<int,_std::allocator<int>_> local_438;
  _Rb_tree<int,std::pair<int_const,face_properties>,std::_Select1st<std::pair<int_const,face_properties>>,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
  *local_420;
  uint local_418;
  int local_414;
  _Base_ptr local_410;
  _Rb_tree<int,_std::pair<const_int,_line>,_std::_Select1st<std::pair<const_int,_line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
  local_408;
  long *local_3d8;
  long local_3d0;
  long local_3c8 [2];
  _Base_ptr local_3b8;
  _Base_ptr local_3b0;
  pair<int,_line> local_3a8 [7];
  ios_base local_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_420 = (_Rb_tree<int,std::pair<int_const,face_properties>,std::_Select1st<std::pair<int_const,face_properties>>,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
               *)faces_map;
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)geo_file_path);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,
             "//======================== Material Shapes =========================\n",0x45);
  p_Var11 = (_Base_ptr)(local_420 + 8);
  iVar3._M_node = *(_Base_ptr *)(local_420 + 0x18);
  while (__position._M_node = iVar3._M_node, __position._M_node != p_Var11) {
    iVar10 = *(int *)((long)&__position._M_node[1]._M_parent + 4);
    iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if (iVar10 == 3) {
      std::
      _Rb_tree<int,std::pair<int_const,face_properties>,std::_Select1st<std::pair<int_const,face_properties>>,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
      ::erase_abi_cxx11_(local_420,__position);
    }
  }
  p_Var7 = (materials_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3b8 = &(materials_map->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 == local_3b8) {
    uVar9 = 0;
  }
  else {
    bVar8 = false;
    local_448 = 0;
    local_410 = p_Var11;
    do {
      local_408._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_408._M_impl.super__Rb_tree_header._M_header;
      local_408._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_408._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_408._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var4 = *(_Base_ptr *)(local_420 + 0x18);
      local_408._M_impl.super__Rb_tree_header._M_header._M_right =
           local_408._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var4 != p_Var11) {
        do {
          if ((*(_Rb_tree_color *)&p_Var4[1]._M_left == p_Var7[1]._M_color) ||
             (*(_Rb_tree_color *)((long)&p_Var4[1]._M_left + 4) == p_Var7[1]._M_color)) {
            local_3a8[0].second.b = *(int *)&p_Var4[1]._M_parent;
            local_3a8[0].first = p_Var4[1]._M_color;
            local_3a8[0].second.a = *(int *)&p_Var4[1].field_0x4;
            local_3a8[0].second.used = false;
            std::
            _Rb_tree<int,std::pair<int_const,line>,std::_Select1st<std::pair<int_const,line>>,std::less<int>,std::allocator<std::pair<int_const,line>>>
            ::_M_emplace_unique<std::pair<int,line>>
                      ((_Rb_tree<int,std::pair<int_const,line>,std::_Select1st<std::pair<int_const,line>>,std::less<int>,std::allocator<std::pair<int_const,line>>>
                        *)&local_408,local_3a8);
          }
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != p_Var11);
        local_414 = (int)local_408._M_impl.super__Rb_tree_header._M_node_count;
        if (((int)local_408._M_impl.super__Rb_tree_header._M_node_count != 0) && (!bVar8)) {
          uVar13 = 0;
          local_43c = 0;
          local_444 = 0;
          local_440 = 0;
          p_Var5 = local_408._M_impl.super__Rb_tree_header._M_header._M_left;
          local_3b0 = p_Var7;
          do {
            local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (int *)0x0;
            local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (int *)0x0;
            local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (int *)0x0;
            if ((uVar13 & 1) == 0) {
              if (*(char *)((long)&p_Var5[1]._M_parent + 4) == '\x01') {
                do {
                  if ((_Rb_tree_header *)p_Var5 == &local_408._M_impl.super__Rb_tree_header) {
                    bVar8 = true;
                  }
                  else {
                    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
                  }
                } while (*(char *)((long)&p_Var5[1]._M_parent + 4) != '\0');
              }
              local_440 = *(int *)&p_Var5[1].field_0x4;
              local_444 = *(uint *)&p_Var5[1]._M_parent;
              if (local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_438,
                           (iterator)
                           local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)(p_Var5 + 1));
              }
              else {
                *local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = p_Var5[1]._M_color;
                local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              *(undefined1 *)((long)&p_Var5[1]._M_parent + 4) = 1;
              local_43c = local_43c + 1;
              uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
            }
            if (bVar8 == false) {
              local_418 = (uint)uVar13;
              uVar9 = 0;
              bVar2 = false;
              do {
                if (*(char *)((long)&p_Var5[1]._M_parent + 4) == '\0') {
                  __args = p_Var5 + 1;
                  iVar10 = *(int *)&p_Var5[1].field_0x4;
                  iVar1 = *(int *)&p_Var5[1]._M_parent;
                  if (local_444 == iVar10) {
                    if (iVar1 == local_440) {
                      bVar2 = true;
                    }
                    local_444 = (uint)(iVar1 == local_440);
                    iVar10 = iVar1;
                    if (local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_438,
                                 (iterator)
                                 local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(int *)__args);
                    }
                    else {
                      *local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = __args->_M_color;
                      local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  else {
                    if (local_444 != iVar1) goto LAB_0013c9da;
                    if (iVar10 == local_440) {
                      bVar2 = true;
                    }
                    local_444 = (uint)(iVar10 == local_440);
                    local_3a8[0].first = -__args->_M_color;
                    if (local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (&local_438,
                                 (iterator)
                                 local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&local_3a8[0].first);
                    }
                    else {
                      *local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = -__args->_M_color;
                      local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  local_448 = local_448 + local_444;
                  *(undefined1 *)((long)&p_Var5[1]._M_parent + 4) = 1;
                  local_43c = local_43c + 1;
                  p_Var5 = local_408._M_impl.super__Rb_tree_header._M_header._M_left;
                  local_444 = iVar10;
                }
LAB_0013c9da:
                if ((_Rb_tree_header *)p_Var5 == &local_408._M_impl.super__Rb_tree_header) {
                  if (!bVar2) {
                    bVar8 = true;
                  }
                }
                else {
                  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
                }
                p_Var7 = local_3b0;
                bVar15 = 0xf423e < uVar9;
                uVar9 = uVar9 + 1;
                if (bVar15) {
                  bVar8 = true;
                }
              } while (bVar8 == false && !bVar2);
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
                p_Var11 = local_410;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3a8,"Curve Loop(",0xb);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_3a8,local_448);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = {",5);
                piVar14 = local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + -1;
                for (piVar12 = local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start; piVar12 != piVar14;
                    piVar12 = piVar12 + 1) {
                  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_3a8,*piVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
                }
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_3a8,*piVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"};\n",3);
                std::__cxx11::stringbuf::str();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,(char *)local_3d8,local_3d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"Plane Surface(",0xe);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_230,local_448);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = {",5);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_448);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"};\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"Physical Surface(\"",0x12);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&local_230,(char *)p_Var7[1]._M_parent,
                                    (long)p_Var7[1]._M_left);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_448);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\") = {",6);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_448);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"};\n",3);
                if (local_3d8 != local_3c8) {
                  operator_delete(local_3d8,local_3c8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
                std::ios_base::~ios_base(local_338);
                uVar13 = 0;
              }
              else {
                uVar13 = (ulong)local_418;
                p_Var11 = local_410;
              }
            }
            if (local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (int *)0x0) {
              operator_delete(local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          } while ((local_43c != local_414) && (!bVar8));
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      std::
      _Rb_tree<int,_std::pair<const_int,_line>,_std::_Select1st<std::pair<const_int,_line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
      ::~_Rb_tree(&local_408);
    } while (p_Var7 != local_3b8);
    uVar9 = (uint)bVar8;
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return uVar9;
}

Assistant:

int generate_shapes(std::map<int, face_properties> &faces_map,
                    std::map<int, std::string> &materials_map,
                    const std::string &geo_file_path)
{
    std::ofstream geo_file;
    geo_file.open(geo_file_path, std::ios::out | std::ios::app);
    geo_file << "//======================== Material Shapes =========================\n";
    bool unable_to_complete_shape = false;
    //First remove the insider faces as we do not require them------------------------
    std::map<int, face_properties>::iterator faces_iterator = faces_map.begin();
    while (faces_iterator != faces_map.end())
    {
        if (faces_iterator->second.face_type == 3)
        {
            std::map<int, face_properties>::iterator placeholder = faces_iterator;
            faces_iterator++;
            faces_map.erase(placeholder);
        }
        else
        {
            faces_iterator++;
        }
    }
    //============================== Shape Finder Code ==============================
    std::map<int, std::string>::iterator material_being_shaped = materials_map.begin();
    int total_shapes_count = 0;
    bool error_reached = false;
    while (material_being_shaped != materials_map.end())
    {
        std::map<int, line> current_faces_map;
        faces_iterator = faces_map.begin();
        // Create a map of all the faces that are borders for this material type
        while (faces_iterator != faces_map.end())
        {
            // if face is child of parent material and is a boundary, add it to the allowable map for border placement.
            if ((faces_iterator->second.parent_materials[0] == material_being_shaped->first) || (faces_iterator->second.parent_materials[1] == material_being_shaped->first))
            {
                line temp;
                temp.a = faces_iterator->second.first_node;
                temp.b = faces_iterator->second.second_node;
                temp.used = false;
                current_faces_map.insert(std::pair<int, line>(faces_iterator->first, temp));
            }
            faces_iterator++;
        }
        // This section looks for loops
        bool new_start_found = false;
        int all_used_requirement = current_faces_map.size();
        int faces_used_counter = 0;
        int origin = 0;
        int current_head = 0;
        std::map<int, line>::iterator current_faces_iterator = current_faces_map.begin();
        // Internal loop to complete all material shapes
        while ((check_for_completion(all_used_requirement, faces_used_counter) == false) && (unable_to_complete_shape == false))
        {
            std::vector<int> current_shape_vector;
            while (new_start_found == false)
            {
                if (current_faces_iterator->second.used == true)
                {
                    if (current_faces_iterator != current_faces_map.end())
                    {
                        current_faces_iterator++;
                    }
                    else
                    {
                        unable_to_complete_shape = true; //Means all shapes were not completed without causing an error
                    }
                }
                else
                {
                    new_start_found = true;
                    origin = current_faces_iterator->second.a;
                    current_head = current_faces_iterator->second.b;
                    current_shape_vector.push_back(current_faces_iterator->first);
                    current_faces_iterator->second.used = true;
                    faces_used_counter++;
                }
            }
            bool current_shape_complete = false;
            bool timed_out = false;
            int submaterial_loop_counter = 0;
            while ((current_shape_complete == false) && (unable_to_complete_shape == false))
            {
                if (current_faces_iterator->second.used == false)
                {
                    if (current_head == current_faces_iterator->second.a)
                    {
                        current_head = current_faces_iterator->second.b;
                        if (current_head == origin) //reached starting point
                        {
                            current_shape_complete = true;
                            total_shapes_count++;
                        }
                        current_shape_vector.push_back(current_faces_iterator->first);
                        current_faces_iterator->second.used = true;
                        faces_used_counter++;
                        current_faces_iterator = current_faces_map.begin(); //Send back to start to check for previously skipped entries that might be relevant now
                    }
                    else if (current_head == current_faces_iterator->second.b)
                    {
                        current_head = current_faces_iterator->second.a;
                        if (current_head == origin) //reached starting point
                        {
                            current_shape_complete = true;
                            total_shapes_count++;
                        }
                        current_shape_vector.push_back(-(current_faces_iterator->first));
                        current_faces_iterator->second.used = true;
                        faces_used_counter++;
                        current_faces_iterator = current_faces_map.begin();
                    }
                }
                if (current_faces_iterator != current_faces_map.end())
                {
                    current_faces_iterator++;
                }
                else
                {
                    if (current_shape_complete == false)
                    {
                        unable_to_complete_shape = true; //never found origin before faces map ended
                    }
                }
                submaterial_loop_counter++;
                if (submaterial_loop_counter >= LOOPTIMEOUT)
                {
                    unable_to_complete_shape = true; //timeout
                }
            }
            if (current_shape_complete == true)
            {
                // plot the vector with a unique curve loop ID & make it a child of physical group
                std::ostringstream curve;
                curve << "Curve Loop(" << total_shapes_count << ") = {";
                auto vector_iterator = current_shape_vector.begin();
                auto final = current_shape_vector.end();
                final--;
                while (vector_iterator != final)
                {
                    curve << *vector_iterator << ", ";
                    vector_iterator++;
                }
                curve << *vector_iterator << "};\n";
                std::string curve_loop = curve.str();
                geo_file << curve_loop;
                geo_file << "Plane Surface(" << total_shapes_count << ") = {" << total_shapes_count << "};\n";
                geo_file << "Physical Surface(\"" << material_being_shaped->second << " " << total_shapes_count << "\") = {" << total_shapes_count << "};\n";
                new_start_found = false;
            }
        }
        if (unable_to_complete_shape == true)
        {
            error_reached = true;
        }
        else
        {
            error_reached = false;
        }
        material_being_shaped++;
    }
    if (error_reached == false)
    {
        return EXIT_SUCCESS;
    }
    else
    {
        return EXIT_FAILURE;
    }
}